

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::SplitNDLayerParams::_InternalSerialize
          (SplitNDLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  void *data;
  bool bVar2;
  byte *ptr;
  LogMessage *other;
  ulong uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  size_t __n;
  byte *pbVar11;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (this->axis_ != 0) {
    puVar4 = target;
    if (stream->end_ <= target) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->axis_;
    *puVar4 = '\b';
    puVar4[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      target = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar5 | 0x80;
      puVar4[2] = (uint8_t)(uVar5 >> 7);
      target = puVar4 + 3;
      if (0x3fff < uVar5) {
        uVar6 = (ulong)puVar4[2];
        uVar5 = uVar5 >> 7;
        do {
          target[-1] = (byte)uVar6 | 0x80;
          uVar3 = uVar5 >> 7;
          *target = (byte)uVar3;
          target = target + 1;
          uVar6 = uVar3 & 0xffffffff;
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar3;
        } while (bVar2);
      }
    }
  }
  ptr = target;
  if (this->numsplits_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->numsplits_;
    *target = 0x10;
    target[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      ptr = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      target[2] = (byte)(uVar5 >> 7);
      ptr = target + 3;
      if (0x3fff < uVar5) {
        uVar6 = (ulong)target[2];
        uVar5 = uVar5 >> 7;
        do {
          ptr[-1] = (byte)uVar6 | 0x80;
          uVar3 = uVar5 >> 7;
          *ptr = (byte)uVar3;
          ptr = ptr + 1;
          uVar6 = uVar3 & 0xffffffff;
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar3;
        } while (bVar2);
      }
    }
  }
  uVar8 = (this->_splitsizes_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    if (stream->end_ <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
    }
    if (stream->end_ <= ptr) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *ptr = 0x1a;
    pbVar11 = ptr + 1;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        ptr = pbVar11;
        *ptr = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar11 = ptr + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar2);
    }
    ptr = ptr + 2;
    *pbVar11 = (byte)uVar8;
    puVar9 = (ulong *)(this->splitsizes_).arena_or_elements_;
    puVar1 = puVar9 + (this->splitsizes_).current_size_;
    do {
      if (stream->end_ <= ptr) {
        ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      }
      uVar5 = *puVar9;
      *ptr = (byte)uVar5;
      if (uVar5 < 0x80) {
        pbVar11 = ptr + 1;
      }
      else {
        *ptr = (byte)uVar5 | 0x80;
        ptr[1] = (byte)(uVar5 >> 7);
        pbVar11 = ptr + 2;
        if (0x3fff < uVar5) {
          uVar6 = (ulong)ptr[1];
          uVar5 = uVar5 >> 7;
          do {
            pbVar11[-1] = (byte)uVar6 | 0x80;
            uVar3 = uVar5 >> 7;
            *pbVar11 = (byte)uVar3;
            pbVar11 = pbVar11 + 1;
            uVar6 = uVar3 & 0xffffffff;
            bVar2 = 0x3fff < uVar5;
            uVar5 = uVar3;
          } while (bVar2);
        }
      }
      ptr = pbVar11;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    data = *(void **)((uVar5 & 0xfffffffffffffffc) + 8);
    uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar5 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)ptr < (long)__n) {
      ptr = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                      (stream,data,(int)puVar10[1],ptr);
    }
    else {
      memcpy(ptr,data,__n);
      ptr = ptr + __n;
    }
  }
  return ptr;
}

Assistant:

uint8_t* SplitNDLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SplitNDLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_axis(), target);
  }

  // uint64 numSplits = 2;
  if (this->_internal_numsplits() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_numsplits(), target);
  }

  // repeated uint64 splitSizes = 3;
  {
    int byte_size = _splitsizes_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          3, _internal_splitsizes(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SplitNDLayerParams)
  return target;
}